

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

Matrix<double,__1,_1,_0,_4,_1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,4,1>>::
_set_noalias<Eigen::Matrix<double,_1,1,0,4,1>>
          (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_4,_1>_> *this,
          DenseBase<Eigen::Matrix<double,__1,_1,_0,_4,_1>_> *other)

{
  Matrix<double,__1,_1,_0,_4,_1> *pMVar1;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,_4,_1>_> *in_RSI;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,_4,_1>_> *in_RDI;
  
  pMVar1 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_4,_1>_>::derived(in_RDI);
  EigenBase<Eigen::Matrix<double,_-1,_1,_0,_4,_1>_>::derived(in_RSI);
  pMVar1 = internal::
           assign_selector<Eigen::Matrix<double,_-1,_1,_0,_4,_1>,_Eigen::Matrix<double,_-1,_1,_0,_4,_1>,_false,_false>
           ::run((Matrix<double,__1,_1,_0,_4,_1> *)in_RSI,pMVar1);
  return pMVar1;
}

Assistant:

EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      return internal::assign_selector<Derived,OtherDerived,false>::run(this->derived(), other.derived());
    }